

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

size_t Curl_cwriter_count(Curl_easy *data,Curl_cwriter_phase phase)

{
  size_t sVar1;
  Curl_cwriter *pCVar2;
  
  sVar1 = 0;
  for (pCVar2 = (data->req).writer_stack; pCVar2 != (Curl_cwriter *)0x0; pCVar2 = pCVar2->next) {
    sVar1 = sVar1 + (pCVar2->phase == phase);
  }
  return sVar1;
}

Assistant:

size_t Curl_cwriter_count(struct Curl_easy *data, Curl_cwriter_phase phase)
{
  struct Curl_cwriter *w;
  size_t n = 0;

  for(w = data->req.writer_stack; w; w = w->next) {
    if(w->phase == phase)
      ++n;
  }
  return n;
}